

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O3

string * gguf_kv_to_str_abi_cxx11_(string *__return_storage_ptr__,gguf_context *ctx_gguf,int i)

{
  gguf_type gVar1;
  uint uVar2;
  char *pcVar3;
  void *data;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  string val;
  stringstream ss;
  string local_238;
  string local_218;
  string local_1f8;
  void *local_1d8;
  string *local_1d0;
  long local_1c8;
  gguf_context *local_1c0;
  allocator<char> local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar6 = (long)i;
  gVar1 = gguf_get_kv_type(ctx_gguf,lVar6);
  if (gVar1 == GGUF_TYPE_ARRAY) {
    gVar1 = gguf_get_arr_type(ctx_gguf,lVar6);
    uVar2 = gguf_get_arr_n(ctx_gguf,lVar6);
    if (gVar1 == GGUF_TYPE_STRING) {
      local_1d8 = (void *)0x0;
    }
    else {
      local_1d8 = (void *)gguf_get_arr_data(ctx_gguf,lVar6);
    }
    local_1c8 = lVar6;
    local_1c0 = ctx_gguf;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    local_1d0 = __return_storage_ptr__;
    if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        if (gVar1 == GGUF_TYPE_STRING) {
          pcVar3 = (char *)gguf_get_arr_str(local_1c0,local_1c8,uVar5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,pcVar3,(allocator<char> *)&local_218);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"\\","");
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\\\\","");
          replace_all(&local_238,&local_218,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"\"","");
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\\\"","");
          replace_all(&local_238,&local_218,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          local_218._M_dataplus._M_p._0_1_ = 0x22;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,(char *)&local_218,1);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_238._M_dataplus._M_p,local_238._M_string_length);
          local_218._M_dataplus._M_p._0_1_ = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_218,1);
LAB_001af7d3:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if (gVar1 != GGUF_TYPE_ARRAY) {
            gguf_data_to_str_abi_cxx11_(&local_238,gVar1,local_1d8,(int)uVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
            goto LAB_001af7d3;
          }
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"???",3);
        }
        if ((long)uVar5 < (long)(int)(uVar2 - 1)) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        uVar5 = uVar5 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
    __return_storage_ptr__ = local_1d0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  else if (gVar1 == GGUF_TYPE_STRING) {
    pcVar3 = (char *)gguf_get_val_str();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar3,local_1b8);
  }
  else {
    data = (void *)gguf_get_val_data(ctx_gguf,lVar6);
    gguf_data_to_str_abi_cxx11_(__return_storage_ptr__,gVar1,data,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string gguf_kv_to_str(const struct gguf_context * ctx_gguf, int i) {
    const enum gguf_type type = gguf_get_kv_type(ctx_gguf, i);

    switch (type) {
        case GGUF_TYPE_STRING:
            return gguf_get_val_str(ctx_gguf, i);
        case GGUF_TYPE_ARRAY:
            {
                const enum gguf_type arr_type = gguf_get_arr_type(ctx_gguf, i);
                int arr_n = gguf_get_arr_n(ctx_gguf, i);
                const void * data = arr_type == GGUF_TYPE_STRING ? nullptr : gguf_get_arr_data(ctx_gguf, i);
                std::stringstream ss;
                ss << "[";
                for (int j = 0; j < arr_n; j++) {
                    if (arr_type == GGUF_TYPE_STRING) {
                        std::string val = gguf_get_arr_str(ctx_gguf, i, j);
                        // escape quotes
                        replace_all(val, "\\", "\\\\");
                        replace_all(val, "\"", "\\\"");
                        ss << '"' << val << '"';
                    } else if (arr_type == GGUF_TYPE_ARRAY) {
                        ss << "???";
                    } else {
                        ss << gguf_data_to_str(arr_type, data, j);
                    }
                    if (j < arr_n - 1) {
                        ss << ", ";
                    }
                }
                ss << "]";
                return ss.str();
            }
        default:
            return gguf_data_to_str(type, gguf_get_val_data(ctx_gguf, i), 0);
    }
}